

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::SSBOBarrierTest::initPrograms
          (SSBOBarrierTest *this,SourceCollections *sourceCollections)

{
  ProgramSources *pPVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"comp0",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout (local_size_x = 1) in;\nlayout(binding = 2) readonly uniform Constants {\n    uint u_baseVal;\n};\nlayout(binding = 1) writeonly buffer Output {\n    uint values[];\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    values[offset] = u_baseVal + offset;\n}\n"
             ,&local_7a);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"comp1",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout (local_size_x = 1) in;\nlayout(binding = 1) readonly buffer Input {\n    uint values[];\n};\nlayout(binding = 0) coherent buffer Output {\n    uint sum;\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    uint value  = values[offset];\n    atomicAdd(sum, value);\n}\n"
             ,&local_7a);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void SSBOBarrierTest::initPrograms (SourceCollections& sourceCollections) const
{
	sourceCollections.glslSources.add("comp0") << glu::ComputeSource(
		"#version 310 es\n"
		"layout (local_size_x = 1) in;\n"
		"layout(binding = 2) readonly uniform Constants {\n"
		"    uint u_baseVal;\n"
		"};\n"
		"layout(binding = 1) writeonly buffer Output {\n"
		"    uint values[];\n"
		"};\n"
		"void main (void) {\n"
		"    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		"    values[offset] = u_baseVal + offset;\n"
		"}\n");

	sourceCollections.glslSources.add("comp1") << glu::ComputeSource(
		"#version 310 es\n"
		"layout (local_size_x = 1) in;\n"
		"layout(binding = 1) readonly buffer Input {\n"
		"    uint values[];\n"
		"};\n"
		"layout(binding = 0) coherent buffer Output {\n"
		"    uint sum;\n"
		"};\n"
		"void main (void) {\n"
		"    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		"    uint value  = values[offset];\n"
		"    atomicAdd(sum, value);\n"
		"}\n");
}